

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFUsedFont.cpp
# Opt level: O3

TextMeasures * __thiscall
PDFUsedFont::CalculateTextDimensions
          (TextMeasures *__return_storage_ptr__,PDFUsedFont *this,string *inText,long inFontSize)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  ULongList *inUnicodeCharacters;
  UnicodeString unicode;
  UIntList glyphs;
  UnicodeString UStack_58;
  UIntList local_40;
  
  local_40.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&local_40;
  local_40.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node._M_size = 0
  ;
  local_40.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
  super__List_node_base._M_prev =
       local_40.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
       super__List_node_base._M_next;
  UnicodeString::UnicodeString(&UStack_58);
  UnicodeString::FromUTF8(&UStack_58,inText);
  inUnicodeCharacters = UnicodeString::GetUnicodeList_abi_cxx11_(&UStack_58);
  FreeTypeFaceWrapper::GetGlyphsForUnicodeText(&this->mFaceWrapper,inUnicodeCharacters,&local_40);
  CalculateTextDimensions(__return_storage_ptr__,this,&local_40,inFontSize);
  UnicodeString::~UnicodeString(&UStack_58);
  p_Var2 = local_40.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
           super__List_node_base._M_next;
  while (p_Var2 != (_List_node_base *)&local_40) {
    p_Var1 = (((_List_base<unsigned_int,_std::allocator<unsigned_int>_> *)&p_Var2->_M_next)->_M_impl
             )._M_node.super__List_node_base._M_next;
    operator_delete(p_Var2,0x18);
    p_Var2 = p_Var1;
  }
  return __return_storage_ptr__;
}

Assistant:

PDFUsedFont::TextMeasures PDFUsedFont::CalculateTextDimensions(const std::string& inText,long inFontSize)
{
	UIntList glyphs;
    UnicodeString unicode;
        
    unicode.FromUTF8(inText);
	mFaceWrapper.GetGlyphsForUnicodeText(unicode.GetUnicodeList(),glyphs);
	return CalculateTextDimensions(glyphs,inFontSize);
}